

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool crnd::crnd_get_texture_info(void *pData,uint32 data_size,crn_texture_info *pInfo)

{
  uint uVar1;
  crn_header *pcVar2;
  uint32 uVar3;
  bool bVar4;
  crn_header *pHeader;
  crn_texture_info *pInfo_local;
  uint32 data_size_local;
  void *pData_local;
  
  if (((pData == (void *)0x0) || (data_size < 0x4a)) || (pInfo == (crn_texture_info *)0x0)) {
    pData_local._7_1_ = false;
  }
  else if (pInfo->m_struct_size == 0x28) {
    pcVar2 = crnd_get_header(pData,data_size);
    if (pcVar2 == (crn_header *)0x0) {
      pData_local._7_1_ = false;
    }
    else {
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar2->m_width);
      pInfo->m_width = uVar1;
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar2->m_height);
      pInfo->m_height = uVar1;
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar2->m_levels);
      pInfo->m_levels = uVar1;
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar2->m_faces);
      pInfo->m_faces = uVar1;
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar2->m_format);
      pInfo->m_format = (ulong)uVar1;
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar2->m_format);
      bVar4 = true;
      if (uVar1 != 0) {
        uVar1 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar2->m_format)
        ;
        bVar4 = true;
        if (uVar1 != 9) {
          uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)&pcVar2->m_format);
          bVar4 = true;
          if (uVar1 != 10) {
            uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                              ((crn_packed_uint *)&pcVar2->m_format);
            bVar4 = true;
            if (uVar1 != 0xb) {
              uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                                ((crn_packed_uint *)&pcVar2->m_format);
              bVar4 = uVar1 == 0xd;
            }
          }
        }
      }
      uVar3 = 0x10;
      if (bVar4) {
        uVar3 = 8;
      }
      pInfo->m_bytes_per_block = uVar3;
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar2->m_userdata0);
      pInfo->m_userdata0 = uVar1;
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar2->m_userdata1);
      pInfo->m_userdata1 = uVar1;
      pData_local._7_1_ = true;
    }
  }
  else {
    pData_local._7_1_ = false;
  }
  return pData_local._7_1_;
}

Assistant:

bool crnd_get_texture_info(const void* pData, uint32 data_size, crn_texture_info* pInfo)
    {
        if ((!pData) || (data_size < sizeof(crn_header)) || (!pInfo))
            return false;

        if (pInfo->m_struct_size != sizeof(crn_texture_info))
            return false;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return false;

        pInfo->m_width = pHeader->m_width;
        pInfo->m_height = pHeader->m_height;
        pInfo->m_levels = pHeader->m_levels;
        pInfo->m_faces = pHeader->m_faces;
        pInfo->m_format = static_cast<crn_format>((uint32)pHeader->m_format);
        pInfo->m_bytes_per_block = pHeader->m_format == cCRNFmtDXT1 || pHeader->m_format == cCRNFmtDXT5A || pHeader->m_format == cCRNFmtETC1 || pHeader->m_format == cCRNFmtETC2 || pHeader->m_format == cCRNFmtETC1S ? 8 : 16;
        pInfo->m_userdata0 = pHeader->m_userdata0;
        pInfo->m_userdata1 = pHeader->m_userdata1;

        return true;
    }